

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

void __thiscall Diligent::SPIRVShaderResources::~SPIRVShaderResources(SPIRVShaderResources *this)

{
  Uint32 UVar1;
  uint local_38;
  uint local_34;
  Uint32 n_9;
  Uint32 n_8;
  Uint32 n_7;
  Uint32 n_6;
  Uint32 n_5;
  Uint32 n_4;
  Uint32 n_3;
  Uint32 n_2;
  Uint32 n_1;
  Uint32 n;
  SPIRVShaderResources *this_local;
  
  n_2 = 0;
  while( true ) {
    UVar1 = GetNumUBs(this);
    if (UVar1 <= n_2) break;
    GetUB(this,n_2);
    n_2 = n_2 + 1;
  }
  n_3 = 0;
  while( true ) {
    UVar1 = GetNumSBs(this);
    if (UVar1 <= n_3) break;
    GetSB(this,n_3);
    n_3 = n_3 + 1;
  }
  n_4 = 0;
  while( true ) {
    UVar1 = GetNumImgs(this);
    if (UVar1 <= n_4) break;
    GetImg(this,n_4);
    n_4 = n_4 + 1;
  }
  n_5 = 0;
  while( true ) {
    UVar1 = GetNumSmpldImgs(this);
    if (UVar1 <= n_5) break;
    GetSmpldImg(this,n_5);
    n_5 = n_5 + 1;
  }
  n_6 = 0;
  while( true ) {
    UVar1 = GetNumACs(this);
    if (UVar1 <= n_6) break;
    GetAC(this,n_6);
    n_6 = n_6 + 1;
  }
  n_7 = 0;
  while( true ) {
    UVar1 = GetNumSepSmplrs(this);
    if (UVar1 <= n_7) break;
    GetSepSmplr(this,n_7);
    n_7 = n_7 + 1;
  }
  n_8 = 0;
  while( true ) {
    UVar1 = GetNumSepImgs(this);
    if (UVar1 <= n_8) break;
    GetSepImg(this,n_8);
    n_8 = n_8 + 1;
  }
  n_9 = 0;
  while( true ) {
    UVar1 = GetNumInptAtts(this);
    if (UVar1 <= n_9) break;
    GetInptAtt(this,n_9);
    n_9 = n_9 + 1;
  }
  local_34 = 0;
  while( true ) {
    UVar1 = GetNumShaderStageInputs(this);
    if (UVar1 <= local_34) break;
    GetShaderStageInputAttribs(this,local_34);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    UVar1 = GetNumAccelStructs(this);
    if (UVar1 <= local_38) break;
    GetAccelStruct(this,local_38);
    local_38 = local_38 + 1;
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_UBReflectionBuffer);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            (&this->m_MemoryBuffer);
  return;
}

Assistant:

SPIRVShaderResources::~SPIRVShaderResources()
{
    for (Uint32 n = 0; n < GetNumUBs(); ++n)
        GetUB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSBs(); ++n)
        GetSB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumImgs(); ++n)
        GetImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSmpldImgs(); ++n)
        GetSmpldImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumACs(); ++n)
        GetAC(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepSmplrs(); ++n)
        GetSepSmplr(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepImgs(); ++n)
        GetSepImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumInptAtts(); ++n)
        GetInptAtt(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumShaderStageInputs(); ++n)
        GetShaderStageInputAttribs(n).~SPIRVShaderStageInputAttribs();

    for (Uint32 n = 0; n < GetNumAccelStructs(); ++n)
        GetAccelStruct(n).~SPIRVShaderResourceAttribs();

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please add destructor for the new resource");
}